

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O0

string * skiwi::anon_unknown_2::build_numerical_script_flonum_first
                   (string *__return_storage_ptr__,int nr_args,bool check_binding,string *prim_name,
                   string *inline_fixnum_name,string *inline_flonum_name)

{
  ostream *poVar1;
  reference pvVar2;
  int local_1f8;
  int local_1f4;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  stringstream local_1d0 [8];
  stringstream str;
  ostream local_1c0 [376];
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  let_names;
  string *inline_flonum_name_local;
  string *inline_fixnum_name_local;
  string *prim_name_local;
  bool check_binding_local;
  int nr_args_local;
  
  let_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = inline_flonum_name;
  if (0 < nr_args) {
    (anonymous_namespace)::make_let_names_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48,(_anonymous_namespace_ *)(ulong)(uint)nr_args,(int)__return_storage_ptr__
              );
    std::__cxx11::stringstream::stringstream(local_1d0);
    std::operator<<(local_1c0,"(let (");
    for (i_2 = 0; i_2 < nr_args; i_2 = i_2 + 1) {
      poVar1 = std::operator<<(local_1c0,"[");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)i_2);
      poVar1 = std::operator<<(poVar1,(string *)pvVar2);
      std::operator<<(poVar1," 0] ");
    }
    std::operator<<(local_1c0,")");
    if (check_binding) {
      poVar1 = std::operator<<(local_1c0,"(if (##eq? ");
      poVar1 = std::operator<<(poVar1,(string *)prim_name);
      poVar1 = std::operator<<(poVar1," ###");
      poVar1 = std::operator<<(poVar1,(string *)prim_name);
      std::operator<<(poVar1,")");
    }
    std::operator<<(local_1c0,"(if ");
    if (1 < nr_args) {
      std::operator<<(local_1c0,"(and ");
    }
    for (i_3 = 0; i_3 < nr_args; i_3 = i_3 + 1) {
      poVar1 = std::operator<<(local_1c0,"(##flonum? ");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)i_3);
      poVar1 = std::operator<<(poVar1,(string *)pvVar2);
      std::operator<<(poVar1,")");
    }
    if (1 < nr_args) {
      std::operator<<(local_1c0,")");
    }
    poVar1 = std::operator<<(local_1c0,"(");
    std::operator<<(poVar1,(string *)inline_flonum_name);
    for (i_4 = 0; i_4 < nr_args; i_4 = i_4 + 1) {
      poVar1 = std::operator<<(local_1c0," ");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)i_4);
      std::operator<<(poVar1,(string *)pvVar2);
    }
    std::operator<<(local_1c0,")");
    std::operator<<(local_1c0,"(if ");
    if (1 < nr_args) {
      std::operator<<(local_1c0,"(and ");
    }
    for (i_5 = 0; i_5 < nr_args; i_5 = i_5 + 1) {
      poVar1 = std::operator<<(local_1c0,"(##fixnum? ");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)i_5);
      poVar1 = std::operator<<(poVar1,(string *)pvVar2);
      std::operator<<(poVar1,")");
    }
    if (1 < nr_args) {
      std::operator<<(local_1c0,")");
    }
    poVar1 = std::operator<<(local_1c0,"(");
    std::operator<<(poVar1,(string *)inline_fixnum_name);
    for (i_6 = 0; i_6 < nr_args; i_6 = i_6 + 1) {
      poVar1 = std::operator<<(local_1c0," ");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)i_6);
      std::operator<<(poVar1,(string *)pvVar2);
    }
    std::operator<<(local_1c0,")");
    poVar1 = std::operator<<(local_1c0,"( ");
    std::operator<<(poVar1,(string *)prim_name);
    for (local_1f4 = 0; local_1f4 < nr_args; local_1f4 = local_1f4 + 1) {
      poVar1 = std::operator<<(local_1c0," ");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(long)local_1f4);
      std::operator<<(poVar1,(string *)pvVar2);
    }
    std::operator<<(local_1c0,")))");
    if (check_binding) {
      poVar1 = std::operator<<(local_1c0,"( ");
      std::operator<<(poVar1,(string *)prim_name);
      for (local_1f8 = 0; local_1f8 < nr_args; local_1f8 = local_1f8 + 1) {
        poVar1 = std::operator<<(local_1c0," ");
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_48,(long)local_1f8);
        std::operator<<(poVar1,(string *)pvVar2);
      }
      std::operator<<(local_1c0,"))");
    }
    std::operator<<(local_1c0,")");
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("nr_args > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/inline_primitives_conversion.cpp"
                ,0xf1,
                "std::string skiwi::(anonymous namespace)::build_numerical_script_flonum_first(int, bool, std::string, std::string, std::string)"
               );
}

Assistant:

std::string build_numerical_script_flonum_first(int nr_args, bool check_binding, std::string prim_name, std::string inline_fixnum_name, std::string inline_flonum_name)
    {
    /*
    this method makes a script of the form
    (let ([x 0] [y 0])
      (if (##eq? + ###+)
          (if (and (##flonum? y) (##flonum? x))
              (##fl+ x y)
              (if (and (##fixnum? y) (##fixnum? x))
                  (##fx+ x y)
                  (+ x y)))
          (+ x y)))
    */
    assert(nr_args > 0);

    std::vector<std::string> let_names = make_let_names(nr_args);
    std::stringstream str;
    str << "(let (";
    for (int i = 0; i < nr_args; ++i)
      {
      str << "[" << let_names[i] << " 0] ";
      }
    str << ")";


    if (check_binding)
      {
      str << "(if (##eq? " << prim_name << " ###" << prim_name << ")";
      }
    str << "(if ";
    if (nr_args > 1)
      {
      str << "(and ";
      }
    for (int i = 0; i < nr_args; ++i)
      str << "(##flonum? " << let_names[i] << ")";
    if (nr_args > 1)
      str << ")"; // close and
    str << "(" << inline_flonum_name;
    for (int i = 0; i < nr_args; ++i)
      str << " " << let_names[i];
    str << ")"; // close flonum call
    str << "(if ";
    if (nr_args > 1)
      {
      str << "(and ";
      }
    for (int i = 0; i < nr_args; ++i)
      str << "(##fixnum? " << let_names[i] << ")";
    if (nr_args > 1)
      str << ")"; // close and
    str << "(" << inline_fixnum_name;
    for (int i = 0; i < nr_args; ++i)
      str << " " << let_names[i];
    str << ")"; // close fixnum call
    str << "( " << prim_name;
    for (int i = 0; i < nr_args; ++i)
      str << " " << let_names[i];
    str << ")))";
    if (check_binding)
      {
      str << "( " << prim_name;
      for (int i = 0; i < nr_args; ++i)
        str << " " << let_names[i];
      str << "))";
      }
    str << ")"; // close let
    return str.str();
    }